

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBColsUp2_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  undefined4 uVar1;
  long lVar2;
  uint32_t *src;
  uint32_t *dst;
  
  for (lVar2 = 0; (int)lVar2 < dst_width + -1; lVar2 = lVar2 + 2) {
    uVar1 = *(undefined4 *)(src_argb + lVar2 * 2);
    *(undefined4 *)(dst_argb + lVar2 * 4) = uVar1;
    *(undefined4 *)(dst_argb + lVar2 * 4 + 4) = uVar1;
  }
  if ((dst_width & 1U) != 0) {
    *(undefined4 *)(dst_argb + lVar2 * 4) = *(undefined4 *)(src_argb + lVar2 * 2);
  }
  return;
}

Assistant:

void ScaleARGBColsUp2_C(uint8_t* dst_argb,
                        const uint8_t* src_argb,
                        int dst_width,
                        int x,
                        int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[1] = dst[0] = src[0];
    src += 1;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}